

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scheduled_tasks.cc
# Opt level: O3

int __thiscall
aliyun::Ess::DescribeScheduledTasks
          (Ess *this,EssDescribeScheduledTasksRequestType *req,
          EssDescribeScheduledTasksResponseType *response,EssErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_1468;
  Value local_1448;
  EssDescribeScheduledTasksResponseType *local_1430;
  long *local_1428;
  long local_1420;
  long local_1418 [2];
  string local_1408;
  string local_13e8;
  undefined1 local_13c8 [32];
  _Alloc_hider local_13a8;
  size_type local_13a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1398;
  _Alloc_hider local_1388;
  size_type local_1380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1378;
  _Alloc_hider local_1368;
  size_type local_1360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1358;
  _Alloc_hider local_1348;
  size_type local_1340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1338;
  _Alloc_hider local_1328;
  size_type local_1320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1318;
  _Alloc_hider local_1308;
  size_type local_1300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12f8;
  _Alloc_hider local_12e8;
  size_type local_12e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12d8;
  Int local_12c8;
  bool local_12c4;
  string local_12c0;
  string local_12a0;
  string local_1280;
  string local_1260;
  string local_1240;
  string local_1220;
  string local_1200;
  string local_11e0;
  string local_11c0;
  string local_11a0;
  string local_1180;
  string local_1160;
  string local_1140;
  string local_1120;
  string local_1100;
  string local_10e0;
  string local_10c0;
  string local_10a0;
  string local_1080;
  string local_1060;
  string local_1040;
  string local_1020;
  string local_1000;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  string local_e40;
  string local_e20;
  string local_e00;
  string local_de0;
  string local_dc0;
  string local_da0;
  string local_d80;
  string local_d60;
  string local_d40;
  string local_d20;
  string local_d00;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_1408._M_dataplus._M_p = (pointer)&local_1408.field_2;
  local_1408._M_string_length = 0;
  local_1408.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_1428 = local_1418;
  local_1430 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1428,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_13c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_1468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_1448);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_1428,local_1420 + (long)local_1428);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_13e8.field_2._M_allocated_capacity = *psVar13;
    local_13e8.field_2._8_8_ = plVar8[3];
    local_13e8._M_dataplus._M_p = (pointer)&local_13e8.field_2;
  }
  else {
    local_13e8.field_2._M_allocated_capacity = *psVar13;
    local_13e8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_13e8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_13e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
    operator_delete(local_13e8._M_dataplus._M_p,local_13e8.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_1448,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeScheduledTasks","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"PageNumber","");
    pcVar2 = (req->page_number)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"PageSize","");
    pcVar2 = (req->page_size)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action1)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"ScheduledAction.1","");
    pcVar2 = (req->scheduled_action1)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar2,pcVar2 + (req->scheduled_action1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action2)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"ScheduledAction.2","");
    pcVar2 = (req->scheduled_action2)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar2,pcVar2 + (req->scheduled_action2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action3)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"ScheduledAction.3","");
    pcVar2 = (req->scheduled_action3)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar2,pcVar2 + (req->scheduled_action3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action4)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ScheduledAction.4","");
    pcVar2 = (req->scheduled_action4)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar2,pcVar2 + (req->scheduled_action4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action5)._M_string_length != 0) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"ScheduledAction.5","");
    pcVar2 = (req->scheduled_action5)._M_dataplus._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar2,pcVar2 + (req->scheduled_action5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action6)._M_string_length != 0) {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"ScheduledAction.6","");
    pcVar2 = (req->scheduled_action6)._M_dataplus._M_p;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,pcVar2,pcVar2 + (req->scheduled_action6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action7)._M_string_length != 0) {
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"ScheduledAction.7","");
    pcVar2 = (req->scheduled_action7)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar2,pcVar2 + (req->scheduled_action7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action8)._M_string_length != 0) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"ScheduledAction.8","");
    pcVar2 = (req->scheduled_action8)._M_dataplus._M_p;
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,pcVar2,pcVar2 + (req->scheduled_action8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action9)._M_string_length != 0) {
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"ScheduledAction.9","");
    pcVar2 = (req->scheduled_action9)._M_dataplus._M_p;
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0,pcVar2,pcVar2 + (req->scheduled_action9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action10)._M_string_length != 0) {
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"ScheduledAction.10","");
    pcVar2 = (req->scheduled_action10)._M_dataplus._M_p;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,pcVar2,pcVar2 + (req->scheduled_action10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action11)._M_string_length != 0) {
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"ScheduledAction.11","");
    pcVar2 = (req->scheduled_action11)._M_dataplus._M_p;
    local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_620,pcVar2,pcVar2 + (req->scheduled_action11)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action12)._M_string_length != 0) {
    local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"ScheduledAction.12","");
    pcVar2 = (req->scheduled_action12)._M_dataplus._M_p;
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_660,pcVar2,pcVar2 + (req->scheduled_action12)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action13)._M_string_length != 0) {
    local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"ScheduledAction.13","");
    pcVar2 = (req->scheduled_action13)._M_dataplus._M_p;
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6a0,pcVar2,pcVar2 + (req->scheduled_action13)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_680,&local_6a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action14)._M_string_length != 0) {
    local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"ScheduledAction.14","");
    pcVar2 = (req->scheduled_action14)._M_dataplus._M_p;
    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6e0,pcVar2,pcVar2 + (req->scheduled_action14)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6c0,&local_6e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
      operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action15)._M_string_length != 0) {
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"ScheduledAction.15","");
    pcVar2 = (req->scheduled_action15)._M_dataplus._M_p;
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_720,pcVar2,pcVar2 + (req->scheduled_action15)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_700,&local_720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action16)._M_string_length != 0) {
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"ScheduledAction.16","");
    pcVar2 = (req->scheduled_action16)._M_dataplus._M_p;
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_760,pcVar2,pcVar2 + (req->scheduled_action16)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_740,&local_760);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action17)._M_string_length != 0) {
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"ScheduledAction.17","");
    pcVar2 = (req->scheduled_action17)._M_dataplus._M_p;
    local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7a0,pcVar2,pcVar2 + (req->scheduled_action17)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_780,&local_7a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action18)._M_string_length != 0) {
    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"ScheduledAction.18","");
    pcVar2 = (req->scheduled_action18)._M_dataplus._M_p;
    local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,pcVar2,pcVar2 + (req->scheduled_action18)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7c0,&local_7e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action19)._M_string_length != 0) {
    local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"ScheduledAction.19","");
    pcVar2 = (req->scheduled_action19)._M_dataplus._M_p;
    local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_820,pcVar2,pcVar2 + (req->scheduled_action19)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_800,&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800._M_dataplus._M_p != &local_800.field_2) {
      operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_action20)._M_string_length != 0) {
    local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"ScheduledAction.20","");
    pcVar2 = (req->scheduled_action20)._M_dataplus._M_p;
    local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,pcVar2,pcVar2 + (req->scheduled_action20)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_840,&local_860);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != &local_840.field_2) {
      operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id1)._M_string_length != 0) {
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"ScheduledTaskId.1","");
    pcVar2 = (req->scheduled_task_id1)._M_dataplus._M_p;
    local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8a0,pcVar2,pcVar2 + (req->scheduled_task_id1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_880,&local_8a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
      operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id2)._M_string_length != 0) {
    local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"ScheduledTaskId.2","");
    pcVar2 = (req->scheduled_task_id2)._M_dataplus._M_p;
    local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8e0,pcVar2,pcVar2 + (req->scheduled_task_id2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8c0,&local_8e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
      operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
      operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id3)._M_string_length != 0) {
    local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"ScheduledTaskId.3","");
    pcVar2 = (req->scheduled_task_id3)._M_dataplus._M_p;
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_920,pcVar2,pcVar2 + (req->scheduled_task_id3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_900,&local_920);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900._M_dataplus._M_p != &local_900.field_2) {
      operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id4)._M_string_length != 0) {
    local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"ScheduledTaskId.4","");
    pcVar2 = (req->scheduled_task_id4)._M_dataplus._M_p;
    local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,pcVar2,pcVar2 + (req->scheduled_task_id4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_940,&local_960);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_dataplus._M_p != &local_960.field_2) {
      operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_940._M_dataplus._M_p != &local_940.field_2) {
      operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id5)._M_string_length != 0) {
    local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"ScheduledTaskId.5","");
    pcVar2 = (req->scheduled_task_id5)._M_dataplus._M_p;
    local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9a0,pcVar2,pcVar2 + (req->scheduled_task_id5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_980,&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
      operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_980._M_dataplus._M_p != &local_980.field_2) {
      operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id6)._M_string_length != 0) {
    local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c0,"ScheduledTaskId.6","");
    pcVar2 = (req->scheduled_task_id6)._M_dataplus._M_p;
    local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9e0,pcVar2,pcVar2 + (req->scheduled_task_id6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_9c0,&local_9e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
      operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
      operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id7)._M_string_length != 0) {
    local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"ScheduledTaskId.7","");
    pcVar2 = (req->scheduled_task_id7)._M_dataplus._M_p;
    local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a20,pcVar2,pcVar2 + (req->scheduled_task_id7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a00,&local_a20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
      operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
      operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id8)._M_string_length != 0) {
    local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"ScheduledTaskId.8","");
    pcVar2 = (req->scheduled_task_id8)._M_dataplus._M_p;
    local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a60,pcVar2,pcVar2 + (req->scheduled_task_id8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a40,&local_a60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
      operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
      operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id9)._M_string_length != 0) {
    local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a80,"ScheduledTaskId.9","");
    pcVar2 = (req->scheduled_task_id9)._M_dataplus._M_p;
    local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_aa0,pcVar2,pcVar2 + (req->scheduled_task_id9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a80,&local_aa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
      operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
      operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id10)._M_string_length != 0) {
    local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"ScheduledTaskId.10","");
    pcVar2 = (req->scheduled_task_id10)._M_dataplus._M_p;
    local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ae0,pcVar2,pcVar2 + (req->scheduled_task_id10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_ac0,&local_ae0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
      operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
      operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id11)._M_string_length != 0) {
    local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"ScheduledTaskId.11","");
    pcVar2 = (req->scheduled_task_id11)._M_dataplus._M_p;
    local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b20,pcVar2,pcVar2 + (req->scheduled_task_id11)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b00,&local_b20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
      operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
      operator_delete(local_b00._M_dataplus._M_p,local_b00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id12)._M_string_length != 0) {
    local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"ScheduledTaskId.12","");
    pcVar2 = (req->scheduled_task_id12)._M_dataplus._M_p;
    local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b60,pcVar2,pcVar2 + (req->scheduled_task_id12)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b40,&local_b60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
      operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
      operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id13)._M_string_length != 0) {
    local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"ScheduledTaskId.13","");
    pcVar2 = (req->scheduled_task_id13)._M_dataplus._M_p;
    local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ba0,pcVar2,pcVar2 + (req->scheduled_task_id13)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b80,&local_ba0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
      operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
      operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id14)._M_string_length != 0) {
    local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,"ScheduledTaskId.14","");
    pcVar2 = (req->scheduled_task_id14)._M_dataplus._M_p;
    local_be0._M_dataplus._M_p = (pointer)&local_be0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_be0,pcVar2,pcVar2 + (req->scheduled_task_id14)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_bc0,&local_be0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
      operator_delete(local_be0._M_dataplus._M_p,local_be0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id15)._M_string_length != 0) {
    local_c00._M_dataplus._M_p = (pointer)&local_c00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c00,"ScheduledTaskId.15","");
    pcVar2 = (req->scheduled_task_id15)._M_dataplus._M_p;
    local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c20,pcVar2,pcVar2 + (req->scheduled_task_id15)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_c00,&local_c20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
      operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
      operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id16)._M_string_length != 0) {
    local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c40,"ScheduledTaskId.16","");
    pcVar2 = (req->scheduled_task_id16)._M_dataplus._M_p;
    local_c60._M_dataplus._M_p = (pointer)&local_c60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c60,pcVar2,pcVar2 + (req->scheduled_task_id16)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_c40,&local_c60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c60._M_dataplus._M_p != &local_c60.field_2) {
      operator_delete(local_c60._M_dataplus._M_p,local_c60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
      operator_delete(local_c40._M_dataplus._M_p,local_c40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id17)._M_string_length != 0) {
    local_c80._M_dataplus._M_p = (pointer)&local_c80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c80,"ScheduledTaskId.17","");
    pcVar2 = (req->scheduled_task_id17)._M_dataplus._M_p;
    local_ca0._M_dataplus._M_p = (pointer)&local_ca0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ca0,pcVar2,pcVar2 + (req->scheduled_task_id17)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_c80,&local_ca0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ca0._M_dataplus._M_p != &local_ca0.field_2) {
      operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c80._M_dataplus._M_p != &local_c80.field_2) {
      operator_delete(local_c80._M_dataplus._M_p,local_c80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id18)._M_string_length != 0) {
    local_cc0._M_dataplus._M_p = (pointer)&local_cc0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc0,"ScheduledTaskId.18","");
    pcVar2 = (req->scheduled_task_id18)._M_dataplus._M_p;
    local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ce0,pcVar2,pcVar2 + (req->scheduled_task_id18)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_cc0,&local_ce0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
      operator_delete(local_ce0._M_dataplus._M_p,local_ce0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
      operator_delete(local_cc0._M_dataplus._M_p,local_cc0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id19)._M_string_length != 0) {
    local_d00._M_dataplus._M_p = (pointer)&local_d00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d00,"ScheduledTaskId.19","");
    pcVar2 = (req->scheduled_task_id19)._M_dataplus._M_p;
    local_d20._M_dataplus._M_p = (pointer)&local_d20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d20,pcVar2,pcVar2 + (req->scheduled_task_id19)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_d00,&local_d20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d20._M_dataplus._M_p != &local_d20.field_2) {
      operator_delete(local_d20._M_dataplus._M_p,local_d20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d00._M_dataplus._M_p != &local_d00.field_2) {
      operator_delete(local_d00._M_dataplus._M_p,local_d00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_id20)._M_string_length != 0) {
    local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d40,"ScheduledTaskId.20","");
    pcVar2 = (req->scheduled_task_id20)._M_dataplus._M_p;
    local_d60._M_dataplus._M_p = (pointer)&local_d60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d60,pcVar2,pcVar2 + (req->scheduled_task_id20)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_d40,&local_d60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d60._M_dataplus._M_p != &local_d60.field_2) {
      operator_delete(local_d60._M_dataplus._M_p,local_d60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d40._M_dataplus._M_p != &local_d40.field_2) {
      operator_delete(local_d40._M_dataplus._M_p,local_d40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name1)._M_string_length != 0) {
    local_d80._M_dataplus._M_p = (pointer)&local_d80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d80,"ScheduledTaskName.1","");
    pcVar2 = (req->scheduled_task_name1)._M_dataplus._M_p;
    local_da0._M_dataplus._M_p = (pointer)&local_da0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_da0,pcVar2,pcVar2 + (req->scheduled_task_name1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_d80,&local_da0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_da0._M_dataplus._M_p != &local_da0.field_2) {
      operator_delete(local_da0._M_dataplus._M_p,local_da0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d80._M_dataplus._M_p != &local_d80.field_2) {
      operator_delete(local_d80._M_dataplus._M_p,local_d80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name2)._M_string_length != 0) {
    local_dc0._M_dataplus._M_p = (pointer)&local_dc0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc0,"ScheduledTaskName.2","");
    pcVar2 = (req->scheduled_task_name2)._M_dataplus._M_p;
    local_de0._M_dataplus._M_p = (pointer)&local_de0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_de0,pcVar2,pcVar2 + (req->scheduled_task_name2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_dc0,&local_de0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_de0._M_dataplus._M_p != &local_de0.field_2) {
      operator_delete(local_de0._M_dataplus._M_p,local_de0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_dc0._M_dataplus._M_p != &local_dc0.field_2) {
      operator_delete(local_dc0._M_dataplus._M_p,local_dc0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name3)._M_string_length != 0) {
    local_e00._M_dataplus._M_p = (pointer)&local_e00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e00,"ScheduledTaskName.3","");
    pcVar2 = (req->scheduled_task_name3)._M_dataplus._M_p;
    local_e20._M_dataplus._M_p = (pointer)&local_e20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e20,pcVar2,pcVar2 + (req->scheduled_task_name3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_e00,&local_e20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e20._M_dataplus._M_p != &local_e20.field_2) {
      operator_delete(local_e20._M_dataplus._M_p,local_e20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e00._M_dataplus._M_p != &local_e00.field_2) {
      operator_delete(local_e00._M_dataplus._M_p,local_e00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name4)._M_string_length != 0) {
    local_e40._M_dataplus._M_p = (pointer)&local_e40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e40,"ScheduledTaskName.4","");
    pcVar2 = (req->scheduled_task_name4)._M_dataplus._M_p;
    local_e60._M_dataplus._M_p = (pointer)&local_e60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e60,pcVar2,pcVar2 + (req->scheduled_task_name4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_e40,&local_e60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e60._M_dataplus._M_p != &local_e60.field_2) {
      operator_delete(local_e60._M_dataplus._M_p,local_e60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e40._M_dataplus._M_p != &local_e40.field_2) {
      operator_delete(local_e40._M_dataplus._M_p,local_e40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name5)._M_string_length != 0) {
    local_e80._M_dataplus._M_p = (pointer)&local_e80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e80,"ScheduledTaskName.5","");
    pcVar2 = (req->scheduled_task_name5)._M_dataplus._M_p;
    local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ea0,pcVar2,pcVar2 + (req->scheduled_task_name5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_e80,&local_ea0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
      operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
      operator_delete(local_e80._M_dataplus._M_p,local_e80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name6)._M_string_length != 0) {
    local_ec0._M_dataplus._M_p = (pointer)&local_ec0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ec0,"ScheduledTaskName.6","");
    pcVar2 = (req->scheduled_task_name6)._M_dataplus._M_p;
    local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ee0,pcVar2,pcVar2 + (req->scheduled_task_name6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_ec0,&local_ee0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
      operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ec0._M_dataplus._M_p != &local_ec0.field_2) {
      operator_delete(local_ec0._M_dataplus._M_p,local_ec0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name7)._M_string_length != 0) {
    local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"ScheduledTaskName.7","");
    pcVar2 = (req->scheduled_task_name7)._M_dataplus._M_p;
    local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f20,pcVar2,pcVar2 + (req->scheduled_task_name7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_f00,&local_f20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
      operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
      operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name8)._M_string_length != 0) {
    local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"ScheduledTaskName.8","");
    pcVar2 = (req->scheduled_task_name8)._M_dataplus._M_p;
    local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f60,pcVar2,pcVar2 + (req->scheduled_task_name8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_f40,&local_f60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
      operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
      operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name9)._M_string_length != 0) {
    local_f80._M_dataplus._M_p = (pointer)&local_f80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f80,"ScheduledTaskName.9","");
    pcVar2 = (req->scheduled_task_name9)._M_dataplus._M_p;
    local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fa0,pcVar2,pcVar2 + (req->scheduled_task_name9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_f80,&local_fa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
      operator_delete(local_fa0._M_dataplus._M_p,local_fa0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f80._M_dataplus._M_p != &local_f80.field_2) {
      operator_delete(local_f80._M_dataplus._M_p,local_f80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name10)._M_string_length != 0) {
    local_fc0._M_dataplus._M_p = (pointer)&local_fc0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_fc0,"ScheduledTaskName.10","");
    pcVar2 = (req->scheduled_task_name10)._M_dataplus._M_p;
    local_fe0._M_dataplus._M_p = (pointer)&local_fe0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fe0,pcVar2,pcVar2 + (req->scheduled_task_name10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_fc0,&local_fe0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fe0._M_dataplus._M_p != &local_fe0.field_2) {
      operator_delete(local_fe0._M_dataplus._M_p,local_fe0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc0._M_dataplus._M_p != &local_fc0.field_2) {
      operator_delete(local_fc0._M_dataplus._M_p,local_fc0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name11)._M_string_length != 0) {
    local_1000._M_dataplus._M_p = (pointer)&local_1000.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1000,"ScheduledTaskName.11","")
    ;
    pcVar2 = (req->scheduled_task_name11)._M_dataplus._M_p;
    local_1020._M_dataplus._M_p = (pointer)&local_1020.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1020,pcVar2,pcVar2 + (req->scheduled_task_name11)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1000,&local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
      operator_delete(local_1020._M_dataplus._M_p,local_1020.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_dataplus._M_p != &local_1000.field_2) {
      operator_delete(local_1000._M_dataplus._M_p,local_1000.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name12)._M_string_length != 0) {
    local_1040._M_dataplus._M_p = (pointer)&local_1040.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1040,"ScheduledTaskName.12","")
    ;
    pcVar2 = (req->scheduled_task_name12)._M_dataplus._M_p;
    local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1060,pcVar2,pcVar2 + (req->scheduled_task_name12)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1040,&local_1060);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
      operator_delete(local_1060._M_dataplus._M_p,local_1060.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1040._M_dataplus._M_p != &local_1040.field_2) {
      operator_delete(local_1040._M_dataplus._M_p,local_1040.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name13)._M_string_length != 0) {
    local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1080,"ScheduledTaskName.13","")
    ;
    pcVar2 = (req->scheduled_task_name13)._M_dataplus._M_p;
    local_10a0._M_dataplus._M_p = (pointer)&local_10a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_10a0,pcVar2,pcVar2 + (req->scheduled_task_name13)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1080,&local_10a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10a0._M_dataplus._M_p != &local_10a0.field_2) {
      operator_delete(local_10a0._M_dataplus._M_p,local_10a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
      operator_delete(local_1080._M_dataplus._M_p,local_1080.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name14)._M_string_length != 0) {
    local_10c0._M_dataplus._M_p = (pointer)&local_10c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_10c0,"ScheduledTaskName.14","")
    ;
    pcVar2 = (req->scheduled_task_name14)._M_dataplus._M_p;
    local_10e0._M_dataplus._M_p = (pointer)&local_10e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_10e0,pcVar2,pcVar2 + (req->scheduled_task_name14)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_10c0,&local_10e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
      operator_delete(local_10e0._M_dataplus._M_p,local_10e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10c0._M_dataplus._M_p != &local_10c0.field_2) {
      operator_delete(local_10c0._M_dataplus._M_p,local_10c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name15)._M_string_length != 0) {
    local_1100._M_dataplus._M_p = (pointer)&local_1100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1100,"ScheduledTaskName.15","")
    ;
    pcVar2 = (req->scheduled_task_name15)._M_dataplus._M_p;
    local_1120._M_dataplus._M_p = (pointer)&local_1120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1120,pcVar2,pcVar2 + (req->scheduled_task_name15)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1100,&local_1120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1120._M_dataplus._M_p != &local_1120.field_2) {
      operator_delete(local_1120._M_dataplus._M_p,local_1120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
      operator_delete(local_1100._M_dataplus._M_p,local_1100.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name16)._M_string_length != 0) {
    local_1140._M_dataplus._M_p = (pointer)&local_1140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1140,"ScheduledTaskName.16","")
    ;
    pcVar2 = (req->scheduled_task_name16)._M_dataplus._M_p;
    local_1160._M_dataplus._M_p = (pointer)&local_1160.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1160,pcVar2,pcVar2 + (req->scheduled_task_name16)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1140,&local_1160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1160._M_dataplus._M_p != &local_1160.field_2) {
      operator_delete(local_1160._M_dataplus._M_p,local_1160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1140._M_dataplus._M_p != &local_1140.field_2) {
      operator_delete(local_1140._M_dataplus._M_p,local_1140.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name17)._M_string_length != 0) {
    local_1180._M_dataplus._M_p = (pointer)&local_1180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1180,"ScheduledTaskName.17","")
    ;
    pcVar2 = (req->scheduled_task_name17)._M_dataplus._M_p;
    local_11a0._M_dataplus._M_p = (pointer)&local_11a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_11a0,pcVar2,pcVar2 + (req->scheduled_task_name17)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1180,&local_11a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11a0._M_dataplus._M_p != &local_11a0.field_2) {
      operator_delete(local_11a0._M_dataplus._M_p,local_11a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1180._M_dataplus._M_p != &local_1180.field_2) {
      operator_delete(local_1180._M_dataplus._M_p,local_1180.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name18)._M_string_length != 0) {
    local_11c0._M_dataplus._M_p = (pointer)&local_11c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_11c0,"ScheduledTaskName.18","")
    ;
    pcVar2 = (req->scheduled_task_name18)._M_dataplus._M_p;
    local_11e0._M_dataplus._M_p = (pointer)&local_11e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_11e0,pcVar2,pcVar2 + (req->scheduled_task_name18)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_11c0,&local_11e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11e0._M_dataplus._M_p != &local_11e0.field_2) {
      operator_delete(local_11e0._M_dataplus._M_p,local_11e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11c0._M_dataplus._M_p != &local_11c0.field_2) {
      operator_delete(local_11c0._M_dataplus._M_p,local_11c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name19)._M_string_length != 0) {
    local_1200._M_dataplus._M_p = (pointer)&local_1200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1200,"ScheduledTaskName.19","")
    ;
    pcVar2 = (req->scheduled_task_name19)._M_dataplus._M_p;
    local_1220._M_dataplus._M_p = (pointer)&local_1220.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1220,pcVar2,pcVar2 + (req->scheduled_task_name19)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1200,&local_1220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1220._M_dataplus._M_p != &local_1220.field_2) {
      operator_delete(local_1220._M_dataplus._M_p,local_1220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1200._M_dataplus._M_p != &local_1200.field_2) {
      operator_delete(local_1200._M_dataplus._M_p,local_1200.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduled_task_name20)._M_string_length != 0) {
    local_1240._M_dataplus._M_p = (pointer)&local_1240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1240,"ScheduledTaskName.20","")
    ;
    pcVar2 = (req->scheduled_task_name20)._M_dataplus._M_p;
    local_1260._M_dataplus._M_p = (pointer)&local_1260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1260,pcVar2,pcVar2 + (req->scheduled_task_name20)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1240,&local_1260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
      operator_delete(local_1260._M_dataplus._M_p,local_1260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1240._M_dataplus._M_p != &local_1240.field_2) {
      operator_delete(local_1240._M_dataplus._M_p,local_1240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_1280._M_dataplus._M_p = (pointer)&local_1280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1280,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_12a0._M_dataplus._M_p = (pointer)&local_12a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_12a0,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_1280,&local_12a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12a0._M_dataplus._M_p != &local_12a0.field_2) {
      operator_delete(local_12a0._M_dataplus._M_p,local_12a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
      operator_delete(local_1280._M_dataplus._M_p,local_1280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_12c0._M_dataplus._M_p = (pointer)&local_12c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_12c0,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_13c8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_12c0,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12c0._M_dataplus._M_p != &local_12c0.field_2) {
      operator_delete(local_12c0._M_dataplus._M_p,local_12c0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_1408);
    if (((0 < iVar4) && (local_1408._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_1408,&local_1448,true), bVar3)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_1448,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_13c8,pVVar10);
        }
        else {
          local_13c8._0_8_ = local_13c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_13c8,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_13c8);
        pcVar2 = local_13c8 + 0x10;
        if ((pointer)local_13c8._0_8_ != pcVar2) {
          operator_delete((void *)local_13c8._0_8_,CONCAT71(local_13c8._17_7_,local_13c8[0x10]) + 1)
          ;
        }
        bVar3 = Json::Value::isMember(&local_1448,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_13c8,pVVar10);
        }
        else {
          local_13c8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_13c8,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_13c8);
        if ((pointer)local_13c8._0_8_ != pcVar2) {
          operator_delete((void *)local_13c8._0_8_,CONCAT71(local_13c8._17_7_,local_13c8[0x10]) + 1)
          ;
        }
        bVar3 = Json::Value::isMember(&local_1448,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_13c8,pVVar10);
        }
        else {
          local_13c8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_13c8,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_13c8);
        if ((pointer)local_13c8._0_8_ != pcVar2) {
          operator_delete((void *)local_13c8._0_8_,CONCAT71(local_13c8._17_7_,local_13c8[0x10]) + 1)
          ;
        }
        bVar3 = Json::Value::isMember(&local_1448,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_13c8,pVVar10);
        }
        else {
          local_13c8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_13c8,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_13c8);
        if ((pointer)local_13c8._0_8_ != pcVar2) {
          operator_delete((void *)local_13c8._0_8_,CONCAT71(local_13c8._17_7_,local_13c8[0x10]) + 1)
          ;
        }
      }
      if (local_1430 != (EssDescribeScheduledTasksResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_1448,"TotalCount");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"TotalCount");
          IVar5 = Json::Value::asInt(pVVar10);
          local_1430->total_count = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_1448,"PageNumber");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"PageNumber");
          IVar5 = Json::Value::asInt(pVVar10);
          local_1430->page_number = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_1448,"PageSize");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"PageSize");
          IVar5 = Json::Value::asInt(pVVar10);
          local_1430->page_size = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_1448,"ScheduledTasks");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_1448,"ScheduledTasks");
          bVar3 = Json::Value::isMember(pVVar10,"ScheduledTask");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_1448,"ScheduledTasks");
            pVVar10 = Json::Value::operator[](pVVar10,"ScheduledTask");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              index = 0;
              do {
                local_13c8._0_8_ = local_13c8 + 0x10;
                local_13c8._8_8_ = 0;
                local_13c8[0x10] = '\0';
                local_13a8._M_p = (pointer)&local_1398;
                local_13a0 = 0;
                local_1398._M_local_buf[0] = '\0';
                local_1388._M_p = (pointer)&local_1378;
                local_1380 = 0;
                local_1378._M_local_buf[0] = '\0';
                local_1368._M_p = (pointer)&local_1358;
                local_1360 = 0;
                local_1358._M_local_buf[0] = '\0';
                local_1348._M_p = (pointer)&local_1338;
                local_1340 = 0;
                local_1338._M_local_buf[0] = '\0';
                local_1328._M_p = (pointer)&local_1318;
                local_1320 = 0;
                local_1318._M_local_buf[0] = '\0';
                local_1308._M_p = (pointer)&local_12f8;
                local_1300 = 0;
                local_12f8._M_local_buf[0] = '\0';
                local_12e8._M_p = (pointer)&local_12d8;
                local_12e0 = 0;
                local_12d8._M_local_buf[0] = '\0';
                pVVar11 = Json::Value::operator[](pVVar10,index);
                bVar3 = Json::Value::isMember(pVVar11,"ScheduledTaskId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScheduledTaskId");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)local_13c8,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScheduledTaskName");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScheduledTaskName");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_13a8,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"Description");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"Description");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_1388,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScheduledAction");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScheduledAction");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_1368,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"RecurrenceEndTime");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"RecurrenceEndTime");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_1348,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"LaunchTime");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"LaunchTime");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_1328,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"RecurrenceType");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"RecurrenceType");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_1308,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"RecurrenceValue");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"RecurrenceValue");
                  Json::Value::asString_abi_cxx11_(&local_1468,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_12e8,(string *)&local_1468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"LaunchExpirationTime");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"LaunchExpirationTime");
                  local_12c8 = Json::Value::asInt(pVVar12);
                }
                bVar3 = Json::Value::isMember(pVVar11,"TaskEnabled");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"TaskEnabled");
                  local_12c4 = Json::Value::asBool(pVVar11);
                }
                std::
                vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
                ::push_back(&local_1430->scheduled_tasks,(value_type *)local_13c8);
                EssDescribeScheduledTasksScheduledTaskType::
                ~EssDescribeScheduledTasksScheduledTaskType
                          ((EssDescribeScheduledTasksScheduledTaskType *)local_13c8);
                AVar6 = Json::Value::size(pVVar10);
                index = index + 1;
              } while (index < AVar6);
            }
          }
        }
      }
      goto LAB_00148e0a;
    }
    if (error_info == (EssErrorInfo *)0x0) goto LAB_00148e05;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (EssErrorInfo *)0x0) {
LAB_00148e05:
      iVar4 = -1;
      goto LAB_00148e0a;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_00148e0a:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_1448);
  if (local_1428 != local_1418) {
    operator_delete(local_1428,local_1418[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._M_dataplus._M_p != &local_1408.field_2) {
    operator_delete(local_1408._M_dataplus._M_p,
                    CONCAT71(local_1408.field_2._M_allocated_capacity._1_7_,
                             local_1408.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Ess::DescribeScheduledTasks(const EssDescribeScheduledTasksRequestType& req,
                      EssDescribeScheduledTasksResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScheduledTasks");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.scheduled_action1.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.1", req.scheduled_action1);
  }
  if(!req.scheduled_action2.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.2", req.scheduled_action2);
  }
  if(!req.scheduled_action3.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.3", req.scheduled_action3);
  }
  if(!req.scheduled_action4.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.4", req.scheduled_action4);
  }
  if(!req.scheduled_action5.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.5", req.scheduled_action5);
  }
  if(!req.scheduled_action6.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.6", req.scheduled_action6);
  }
  if(!req.scheduled_action7.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.7", req.scheduled_action7);
  }
  if(!req.scheduled_action8.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.8", req.scheduled_action8);
  }
  if(!req.scheduled_action9.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.9", req.scheduled_action9);
  }
  if(!req.scheduled_action10.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.10", req.scheduled_action10);
  }
  if(!req.scheduled_action11.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.11", req.scheduled_action11);
  }
  if(!req.scheduled_action12.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.12", req.scheduled_action12);
  }
  if(!req.scheduled_action13.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.13", req.scheduled_action13);
  }
  if(!req.scheduled_action14.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.14", req.scheduled_action14);
  }
  if(!req.scheduled_action15.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.15", req.scheduled_action15);
  }
  if(!req.scheduled_action16.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.16", req.scheduled_action16);
  }
  if(!req.scheduled_action17.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.17", req.scheduled_action17);
  }
  if(!req.scheduled_action18.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.18", req.scheduled_action18);
  }
  if(!req.scheduled_action19.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.19", req.scheduled_action19);
  }
  if(!req.scheduled_action20.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.20", req.scheduled_action20);
  }
  if(!req.scheduled_task_id1.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.1", req.scheduled_task_id1);
  }
  if(!req.scheduled_task_id2.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.2", req.scheduled_task_id2);
  }
  if(!req.scheduled_task_id3.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.3", req.scheduled_task_id3);
  }
  if(!req.scheduled_task_id4.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.4", req.scheduled_task_id4);
  }
  if(!req.scheduled_task_id5.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.5", req.scheduled_task_id5);
  }
  if(!req.scheduled_task_id6.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.6", req.scheduled_task_id6);
  }
  if(!req.scheduled_task_id7.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.7", req.scheduled_task_id7);
  }
  if(!req.scheduled_task_id8.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.8", req.scheduled_task_id8);
  }
  if(!req.scheduled_task_id9.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.9", req.scheduled_task_id9);
  }
  if(!req.scheduled_task_id10.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.10", req.scheduled_task_id10);
  }
  if(!req.scheduled_task_id11.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.11", req.scheduled_task_id11);
  }
  if(!req.scheduled_task_id12.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.12", req.scheduled_task_id12);
  }
  if(!req.scheduled_task_id13.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.13", req.scheduled_task_id13);
  }
  if(!req.scheduled_task_id14.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.14", req.scheduled_task_id14);
  }
  if(!req.scheduled_task_id15.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.15", req.scheduled_task_id15);
  }
  if(!req.scheduled_task_id16.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.16", req.scheduled_task_id16);
  }
  if(!req.scheduled_task_id17.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.17", req.scheduled_task_id17);
  }
  if(!req.scheduled_task_id18.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.18", req.scheduled_task_id18);
  }
  if(!req.scheduled_task_id19.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.19", req.scheduled_task_id19);
  }
  if(!req.scheduled_task_id20.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.20", req.scheduled_task_id20);
  }
  if(!req.scheduled_task_name1.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.1", req.scheduled_task_name1);
  }
  if(!req.scheduled_task_name2.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.2", req.scheduled_task_name2);
  }
  if(!req.scheduled_task_name3.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.3", req.scheduled_task_name3);
  }
  if(!req.scheduled_task_name4.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.4", req.scheduled_task_name4);
  }
  if(!req.scheduled_task_name5.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.5", req.scheduled_task_name5);
  }
  if(!req.scheduled_task_name6.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.6", req.scheduled_task_name6);
  }
  if(!req.scheduled_task_name7.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.7", req.scheduled_task_name7);
  }
  if(!req.scheduled_task_name8.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.8", req.scheduled_task_name8);
  }
  if(!req.scheduled_task_name9.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.9", req.scheduled_task_name9);
  }
  if(!req.scheduled_task_name10.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.10", req.scheduled_task_name10);
  }
  if(!req.scheduled_task_name11.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.11", req.scheduled_task_name11);
  }
  if(!req.scheduled_task_name12.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.12", req.scheduled_task_name12);
  }
  if(!req.scheduled_task_name13.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.13", req.scheduled_task_name13);
  }
  if(!req.scheduled_task_name14.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.14", req.scheduled_task_name14);
  }
  if(!req.scheduled_task_name15.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.15", req.scheduled_task_name15);
  }
  if(!req.scheduled_task_name16.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.16", req.scheduled_task_name16);
  }
  if(!req.scheduled_task_name17.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.17", req.scheduled_task_name17);
  }
  if(!req.scheduled_task_name18.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.18", req.scheduled_task_name18);
  }
  if(!req.scheduled_task_name19.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.19", req.scheduled_task_name19);
  }
  if(!req.scheduled_task_name20.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.20", req.scheduled_task_name20);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}